

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O0

QString * __thiscall
QUrlQuery::queryItemValue(QUrlQuery *this,QString *key,ComponentFormattingOptions encoding)

{
  bool bVar1;
  const_iterator o;
  QUrlQueryPrivate *in_RDI;
  long in_FS_OFFSET;
  QFlagsStorage<QUrl::ComponentFormattingOption> in_stack_00000024;
  QString *result;
  const_iterator it;
  QString *in_stack_ffffffffffffff48;
  QList<std::pair<QString,_QString>_> *in_stack_ffffffffffffff50;
  QUrlQueryPrivate *this_00;
  QString *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 uVar2;
  const_iterator local_18 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->itemList).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->itemList).d.ptr = (pair<QString,_QString> *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QString::QString((QString *)0x314e63);
  bVar1 = ::QSharedDataPointer::operator_cast_to_bool
                    ((QSharedDataPointer<QUrlQueryPrivate> *)0x314e6d);
  if (bVar1) {
    local_18[0].i = (pair<QString,_QString> *)&DAT_aaaaaaaaaaaaaaaa;
    QSharedDataPointer<QUrlQueryPrivate>::operator->
              ((QSharedDataPointer<QUrlQueryPrivate> *)0x314e92);
    local_18[0] = QUrlQueryPrivate::findKey(this_00,(QString *)in_RDI);
    QSharedDataPointer<QUrlQueryPrivate>::operator->
              ((QSharedDataPointer<QUrlQueryPrivate> *)0x314ebd);
    o = QList<std::pair<QString,_QString>_>::constEnd(in_stack_ffffffffffffff50);
    bVar1 = QList<std::pair<QString,_QString>_>::const_iterator::operator!=(local_18,o);
    if (bVar1) {
      QSharedDataPointer<QUrlQueryPrivate>::operator->
                ((QSharedDataPointer<QUrlQueryPrivate> *)0x314efd);
      QList<std::pair<QString,_QString>_>::const_iterator::operator->(local_18);
      QUrlQueryPrivate::recodeToUser
                ((QUrlQueryPrivate *)CONCAT17(uVar2,in_stack_ffffffffffffffa8),
                 in_stack_ffffffffffffffa0,(ComponentFormattingOptions)in_stack_00000024.i);
      QString::operator=((QString *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      QString::~QString((QString *)0x314f67);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QString QUrlQuery::queryItemValue(const QString &key, QUrl::ComponentFormattingOptions encoding) const
{
    QString result;
    if (d) {
        Map::const_iterator it = d->findKey(key);
        if (it != d->itemList.constEnd())
            result = d->recodeToUser(it->second, encoding);
    }
    return result;
}